

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

void dumpObject(object *obj,int indent)

{
  object *local_60;
  object *local_58;
  object *local_50;
  object *local_48;
  object *local_40;
  object *local_38;
  object *name;
  object *cls;
  int i_2;
  int i_1;
  int i;
  int indent_local;
  object *obj_local;
  
  for (i_2 = 0; i_2 < indent; i_2 = i_2 + 1) {
    fputc(0x20,_stderr);
  }
  if (((ulong)obj & 1) == 0) {
    local_38 = obj->class;
  }
  else {
    local_38 = SmallIntClass;
  }
  if (local_38 == SmallIntClass) {
    fprintf(_stderr,"%d",(long)obj >> 1 & 0xffffffff);
  }
  else {
    if (((ulong)obj & 1) == 0) {
      local_40 = obj->class;
    }
    else {
      local_40 = SmallIntClass;
    }
    if (local_40 == UndefinedClass) {
      fprintf(_stderr,"nil");
    }
    else {
      if (((ulong)obj & 1) == 0) {
        local_48 = obj->class;
      }
      else {
        local_48 = SmallIntClass;
      }
      if (local_48 == SymbolClass) {
        fprintf(_stderr,"#%.*s",obj->header >> 2 & 0x3fffffff,obj + 1);
      }
      else {
        if (((ulong)obj & 1) == 0) {
          local_50 = obj->class;
        }
        else {
          local_50 = SmallIntClass;
        }
        if (local_50 == StringClass) {
          fprintf(_stderr,"\'%.*s\'",obj->header >> 2 & 0x3fffffff,obj + 1);
        }
        else {
          if (((ulong)obj & 1) == 0) {
            local_58 = obj->class;
          }
          else {
            local_58 = SmallIntClass;
          }
          if (local_58 == ArrayClass) {
            fprintf(_stderr,"#(");
            for (cls._4_4_ = 0; cls._4_4_ < (int)((uint)(obj->header >> 2) & 0x3fffffff);
                cls._4_4_ = cls._4_4_ + 1) {
              dumpObject((object *)(&obj[1].header)[cls._4_4_],1);
            }
            fprintf(_stderr," )");
          }
          else if ((obj->header & 2) == 0) {
            if (((ulong)obj & 1) == 0) {
              local_60 = obj->class;
            }
            else {
              local_60 = SmallIntClass;
            }
            fprintf(_stderr,"%.*s",*(ulong *)local_60[1].header >> 2 & 0x3fffffff,
                    (ulong *)local_60[1].header + 2);
          }
          else {
            fprintf(_stderr,"%.*s #(",*(ulong *)obj->class[1].header >> 2 & 0x3fffffff,
                    obj->class[1].header + 0x10);
            for (cls._0_4_ = 0; (int)cls < (int)((uint)(obj->header >> 2) & 0x3fffffff);
                cls._0_4_ = (int)cls + 1) {
              fprintf(_stderr," %02x",(ulong)*(byte *)((long)&obj[1].header + (long)(int)cls));
            }
            fprintf(_stderr," )");
          }
        }
      }
    }
  }
  return;
}

Assistant:

void dumpObject(struct object *obj, int indent)
{
    for(int i=0; i < indent; i++) {
        fputc(' ', stderr);
    }

    if(CLASS(obj) == SmallIntClass) {
        fprintf(stderr, "%d", integerValue(obj));
    } else if(CLASS(obj) == UndefinedClass) {
        fprintf(stderr, "nil");
    } else if(CLASS(obj) == SymbolClass) {
        fprintf(stderr, "#%.*s", SIZE(obj), (char *)bytePtr(obj));
    } else if(CLASS(obj) == StringClass) {
        fprintf(stderr, "'%.*s'", SIZE(obj), (char *)bytePtr(obj));
    } else if(CLASS(obj) == ArrayClass) {
        fprintf(stderr, "#(");
        for(int i=0; i < (int)SIZE(obj); i++) {
            dumpObject(obj->data[i], 1);
        }
        fprintf(stderr, " )");
    } else if(IS_BINOBJ(obj)) {
        fprintf(stderr, "%.*s #(", SIZE(obj->class->data[nameInClass]), (char *)bytePtr(obj->class->data[nameInClass]));
        for(int i=0; i < (int)SIZE(obj); i++) {
            fprintf(stderr," %02x", bytePtr(obj)[i]);
        }
        fprintf(stderr, " )");
    } else {
        struct object *cls = CLASS(obj);
        struct object *name = cls->data[nameInClass];

        fprintf(stderr, "%.*s", SIZE(name), (char *)bytePtr(name));
    }
}